

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void ui_init(void)

{
  ImGuiIO *pIVar1;
  
  ImGui::DebugCheckVersionAndDataLayout("1.75",0x1550,0x3b4,8,0x10,0x14,2);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  pIVar1 = ImGui::GetIO();
  pIVar1->BackendPlatformName = "atto";
  pIVar1->KeyMap[0] = 9;
  pIVar1->KeyMap[1] = 0x25;
  pIVar1->KeyMap[2] = 0x27;
  pIVar1->KeyMap[3] = 0x26;
  pIVar1->KeyMap[4] = 0x28;
  pIVar1->KeyMap[5] = 0x21;
  pIVar1->KeyMap[6] = 0x22;
  pIVar1->KeyMap[7] = 0x9a;
  pIVar1->KeyMap[8] = 0x9b;
  pIVar1->KeyMap[9] = 0x80;
  pIVar1->KeyMap[10] = 0x7f;
  pIVar1->KeyMap[0xb] = 8;
  pIVar1->KeyMap[0xc] = 0x20;
  pIVar1->KeyMap[0xd] = 0xd;
  pIVar1->KeyMap[0xe] = 0x1b;
  pIVar1->KeyMap[0x10] = 0x61;
  pIVar1->KeyMap[0x11] = 99;
  pIVar1->KeyMap[0x12] = 0x76;
  pIVar1->KeyMap[0x13] = 0x78;
  pIVar1->KeyMap[0x14] = 0x79;
  pIVar1->KeyMap[0x15] = 0x7a;
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  ImGui_ImplOpenGL2_Init();
  return;
}

Assistant:

void ui_init() {
	IMGUI_CHECKVERSION();
	ImGui::CreateContext();

	ImGuiIO& io = ImGui::GetIO();
	io.BackendPlatformName = "atto";
	io.KeyMap[ImGuiKey_Tab] = AK_Tab;
	io.KeyMap[ImGuiKey_LeftArrow] = AK_Left;
	io.KeyMap[ImGuiKey_RightArrow] = AK_Right;
	io.KeyMap[ImGuiKey_UpArrow] = AK_Up;
	io.KeyMap[ImGuiKey_DownArrow] = AK_Down;
	io.KeyMap[ImGuiKey_PageUp] = AK_PageUp;
	io.KeyMap[ImGuiKey_PageDown] = AK_PageDown;
	io.KeyMap[ImGuiKey_Home] = AK_Home;
	io.KeyMap[ImGuiKey_End] = AK_End;
	io.KeyMap[ImGuiKey_Insert] = AK_Ins;
	io.KeyMap[ImGuiKey_Delete] = AK_Del;
	io.KeyMap[ImGuiKey_Backspace] = AK_Backspace;
	io.KeyMap[ImGuiKey_Space] = AK_Space;
	io.KeyMap[ImGuiKey_Enter] = AK_Enter;
	io.KeyMap[ImGuiKey_Escape] = AK_Esc;
	// TODO io.KeyMap[ImGuiKey_KeyPadEnter] = AK_KeyPadEnter;
	io.KeyMap[ImGuiKey_A] = AK_A;
	io.KeyMap[ImGuiKey_C] = AK_C;
	io.KeyMap[ImGuiKey_V] = AK_V;
	io.KeyMap[ImGuiKey_X] = AK_X;
	io.KeyMap[ImGuiKey_Y] = AK_Y;
	io.KeyMap[ImGuiKey_Z] = AK_Z;

	ImGui::StyleColorsDark();
	ImGui_ImplOpenGL2_Init();
}